

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_set_restricted(Integer g_a,Integer *list,Integer size)

{
  Integer IVar1;
  C_Integer *pCVar2;
  global_array_t *pgVar3;
  uint uVar4;
  long lVar5;
  C_Integer CVar6;
  long lVar7;
  long icode;
  long lVar8;
  C_Integer CVar9;
  Integer local_40;
  
  pgVar3 = GA;
  lVar8 = g_a + 1000;
  GA[lVar8].num_rstrctd = size;
  pCVar2 = (C_Integer *)malloc(size * 8);
  pgVar3[lVar8].rstrctd_list = pCVar2;
  IVar1 = GAnproc;
  pCVar2 = (C_Integer *)malloc(GAnproc * 8);
  GA[lVar8].rank_rstrctd = pCVar2;
  pgVar3 = GA;
  uVar4 = GA[lVar8].p_handle;
  if (GA[lVar8].p_handle == 0xfffffffe) {
    uVar4 = GA_Default_Proc_Group;
  }
  if ((int)uVar4 < 1) {
    local_40 = IVar1;
    lVar7 = GAme;
  }
  else {
    local_40 = (Integer)PGRP_LIST[uVar4].map_nproc;
    lVar7 = (long)PGRP_LIST[uVar4].map_proc_list[GAme];
  }
  if (0 < IVar1) {
    pCVar2 = GA[lVar8].rank_rstrctd;
    lVar5 = 0;
    do {
      pCVar2[lVar5] = -1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < GAnproc);
  }
  if (size < 1) {
    CVar9 = 0;
    CVar6 = 0;
  }
  else {
    lVar5 = 0;
    CVar6 = 0;
    CVar9 = 0;
    do {
      icode = list[lVar5];
      if (lVar7 == icode) {
        CVar9 = lVar5;
      }
      pgVar3[lVar8].rstrctd_list[lVar5] = icode;
      if (lVar7 == icode) {
        CVar6 = 1;
      }
      if ((icode < 0) || (local_40 <= icode)) {
        pnga_error("Invalid processor in list",icode);
        icode = list[lVar5];
        pgVar3 = GA;
      }
      pgVar3[lVar8].rank_rstrctd[icode] = lVar5;
      lVar5 = lVar5 + 1;
    } while (size != lVar5);
  }
  pgVar3[lVar8].has_data = CVar6;
  pgVar3[lVar8].rstrctd_id = CVar9;
  return;
}

Assistant:

void pnga_set_restricted(Integer g_a, Integer *list, Integer size)
{
  Integer i, ig, id=0, me, p_handle, has_data, nproc;
  Integer ga_handle = g_a + GA_OFFSET;
  GA[ga_handle].num_rstrctd = size;
  GA[ga_handle].rstrctd_list = (Integer*)malloc(size*sizeof(Integer));
  GA[ga_handle].rank_rstrctd = (Integer*)malloc((GAnproc)*sizeof(Integer));
  p_handle = GA[ga_handle].p_handle;
  if (p_handle == -2) p_handle = pnga_pgroup_get_default();
  if (p_handle > 0) {
    me = PGRP_LIST[p_handle].map_proc_list[GAme];
    nproc = PGRP_LIST[p_handle].map_nproc;
  } else {
    me = GAme;
    nproc = GAnproc;
  }
  has_data = 0;

  for (i=0; i<GAnproc; i++) {
    GA[ga_handle].rank_rstrctd[i] = -1;
  }

  for (i=0; i<size; i++) {
    GA[ga_handle].rstrctd_list[i] = list[i];
    /* check if processor is in list */
    if (me == list[i]) {
      has_data = 1;
      id = i;
    }
    /* check if processor is in group */
    if (list[i] < 0 || list[i] >= nproc)
      pnga_error("Invalid processor in list",list[i]);
    ig = list[i];
    GA[ga_handle].rank_rstrctd[ig] = i;
  }
  GA[ga_handle].has_data = has_data;
  GA[ga_handle].rstrctd_id = id;
}